

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lengauer_tarjan.cpp
# Opt level: O0

void __thiscall LengauerTarjan::COMPRESS(LengauerTarjan *this,int v)

{
  int iVar1;
  value_type vVar2;
  reference pvVar3;
  int in_ESI;
  long in_RDI;
  undefined4 in_stack_fffffffffffffff0;
  
  pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                     ((vector<int,_std::allocator<int>_> *)(in_RDI + 0xc0),(long)in_ESI);
  if (*pvVar3 != -1) {
    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0xc0),(long)in_ESI);
    pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0xc0),(long)*pvVar3);
    if (*pvVar3 != -1) {
      std::vector<int,_std::allocator<int>_>::operator[]
                ((vector<int,_std::allocator<int>_> *)(in_RDI + 0xc0),(long)in_ESI);
      COMPRESS((LengauerTarjan *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),
               (int)((ulong)in_RDI >> 0x20));
      pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RDI + 0xc0),(long)in_ESI);
      pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RDI + 0xd8),(long)*pvVar3);
      pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x88),(long)*pvVar3);
      iVar1 = *pvVar3;
      pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RDI + 0xd8),(long)in_ESI);
      pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x88),(long)*pvVar3);
      if (iVar1 < *pvVar3) {
        pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)(in_RDI + 0xc0),(long)in_ESI);
        pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)(in_RDI + 0xd8),(long)*pvVar3);
        vVar2 = *pvVar3;
        pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)(in_RDI + 0xd8),(long)in_ESI);
        *pvVar3 = vVar2;
      }
      pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RDI + 0xc0),(long)in_ESI);
      pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RDI + 0xc0),(long)*pvVar3);
      vVar2 = *pvVar3;
      pvVar3 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)(in_RDI + 0xc0),(long)in_ESI);
      *pvVar3 = vVar2;
    }
  }
  return;
}

Assistant:

void LengauerTarjan::COMPRESS(int v) {
	if (ancestor[v] == -1) {
		return;
	}
	if (ancestor[ancestor[v]] != -1) {
		COMPRESS(ancestor[v]);
		if (semi[label[ancestor[v]]] < semi[label[v]]) {
			label[v] = label[ancestor[v]];
		}
		ancestor[v] = ancestor[ancestor[v]];
	}
}